

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O2

void __thiscall
soul::heart::Printer::PrinterStream::printDescription(PrinterStream *this,Annotation *annotation)

{
  CodePrinter *this_00;
  string local_30;
  
  this_00 = this->out;
  Annotation::toHEART_abi_cxx11_(&local_30,annotation);
  choc::text::CodePrinter::operator<<(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void printDescription (const Annotation& annotation)
        {
            out << annotation.toHEART();
        }